

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O2

SourceRange __thiscall slang::syntax::DeferredSourceRange::get(DeferredSourceRange *this)

{
  SyntaxNode *this_00;
  ulong uVar1;
  SourceRange SVar2;
  
  this_00 = (SyntaxNode *)(this->node).value;
  if (((ulong)this_00 & 1) == 0) {
    if (this_00 == (SyntaxNode *)0x0) {
      uVar1 = 1;
    }
    else {
      SVar2 = SyntaxNode::sourceRange(this_00);
      this->range = SVar2;
      uVar1 = (this->node).value | 1;
    }
    (this->node).value = uVar1;
  }
  return this->range;
}

Assistant:

SourceRange get() const {
        if (!node.getInt()) {
            if (auto ptr = node.getPointer())
                range = ptr->sourceRange();
            node.setInt(true);
        }
        return range;
    }